

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int type_set_bit_size(parser_info *info)

{
  node_info *pnVar1;
  coda_type *type;
  int iVar2;
  
  pnVar1 = info->node;
  type = (coda_type *)pnVar1->parent->data;
  if ((coda_expression *)pnVar1->data == (coda_expression *)0x0) {
    iVar2 = coda_type_set_bit_size(type,pnVar1->integer_data);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else {
    iVar2 = coda_type_set_bit_size_expression(type,(coda_expression *)pnVar1->data);
    if (iVar2 != 0) {
      return -1;
    }
    info->node->data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int type_set_bit_size(parser_info *info)
{
    if (info->node->data != NULL)
    {
        if (coda_type_set_bit_size_expression((coda_type *)info->node->parent->data,
                                              (coda_expression *)info->node->data) != 0)
        {
            return -1;
        }
        info->node->data = NULL;
    }
    else
    {
        if (coda_type_set_bit_size((coda_type *)info->node->parent->data, (long)info->node->integer_data) != 0)
        {
            return -1;
        }
    }
    return 0;
}